

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O0

LinkedList<char> * __thiscall
data_structures::LinkedList<char>::insertAfterNode
          (LinkedList<char> *this,ListNode<char> *_current,char *new_element)

{
  ListNode<char> *pLVar1;
  char *new_element_local;
  ListNode<char> *_current_local;
  LinkedList<char> *this_local;
  
  pLVar1 = (ListNode<char> *)operator_new(0x18);
  ListNode<char>::ListNode(pLVar1,new_element,(ListNode<char> *)0x0);
  ListNode<char>::insertAfter(_current,pLVar1);
  this->_size = this->_size + 1;
  if (_current == this->_tail) {
    pLVar1 = ListNode<char>::next(_current);
    this->_tail = pLVar1;
  }
  return this;
}

Assistant:

inline
    LinkedList<T>* LinkedList<T>::insertAfterNode(ListNode<T>* _current, const T &new_element){
        _current->insertAfter(new ListNode<T>(new_element));
        _size++;
        if (_current == _tail) {
            _tail = _current->next();
        }
        return this;
    }